

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

bool __thiscall
QUrlPrivate::validateComponent
          (QUrlPrivate *this,Section section,QString *input,qsizetype begin,qsizetype end)

{
  char16_t cVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  Error *this_00;
  size_t __n;
  long lVar5;
  char *__s;
  ulong uVar6;
  char16_t *pcVar7;
  ErrorCode EVar8;
  bool bVar9;
  bool bVar10;
  
  pcVar7 = (input->d).ptr;
  if (pcVar7 == (char16_t *)0x0) {
    pcVar7 = L"";
  }
  bVar9 = (ulong)end <= (ulong)begin;
  if (!bVar9) {
    lVar5 = 0;
    uVar6 = begin;
    do {
      cVar1 = pcVar7[uVar6];
      if ((ushort)cVar1 < 0x80) {
        if (cVar1 == L'%') {
          bVar10 = true;
          if (((uVar6 + 2 <= (ulong)end) &&
              ((uVar2 = (int)(char)pcVar7[uVar6 + 1] | 0x20, (byte)((char)uVar2 + 0x9fU) < 6 ||
               (uVar2 - 0x30 < 10)))) &&
             ((uVar2 = (int)(char)pcVar7[uVar6 + 2] | 0x20, (byte)((char)uVar2 + 0x9fU) < 6 ||
              (uVar2 - 0x30 < 10)))) {
LAB_0025d112:
            pvVar3 = memchr("\"<>\\^`{|}\x7f",(uint)(ushort)cVar1,0xb);
            bVar10 = pvVar3 != (void *)0x0;
            if ((section & UserInfo) != ~FullUrl && !bVar10) {
              if (section == UserInfo) {
                __n = 7;
                __s = "/?#[]@";
              }
              else {
                __n = 8;
                __s = ":/?#[]@";
              }
              pvVar3 = memchr(__s,(uint)(ushort)cVar1,__n);
              bVar10 = pvVar3 != (void *)0x0;
            }
          }
        }
        else {
          bVar10 = true;
          if (0x20 < (ushort)cVar1) goto LAB_0025d112;
        }
        if (bVar10) {
          EVar8 = (uint)section << 8;
          if ((section == UserInfo) && (EVar8 = InvalidUserNameError, (ulong)begin < uVar6)) {
            lVar4 = 0;
            do {
              if (pcVar7[begin + lVar4] == L':') {
                EVar8 = InvalidPasswordError;
                break;
              }
              lVar4 = lVar4 + 1;
            } while (lVar5 != lVar4);
          }
          if ((this->error)._M_t.
              super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>.
              _M_t.
              super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>
              .super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl == (Error *)0x0) {
            this_00 = (Error *)operator_new(0x28);
            (this_00->source).d.d = (Data *)0x0;
            (this_00->source).d.ptr = (char16_t *)0x0;
            (this_00->source).d.size = 0;
            this_00->position = 0;
            *(undefined8 *)&this_00->code = 0;
            (this->error)._M_t.
            super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t
            .super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
            super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl = this_00;
            this_00->code = EVar8;
            QString::operator=((QString *)this_00,input);
            ((this->error)._M_t.
             super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>.
             _M_t.
             super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
             super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl)->position = uVar6;
          }
          if (bVar10) {
            return bVar9;
          }
        }
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 1;
      bVar9 = (ulong)end <= uVar6;
    } while (uVar6 != end);
  }
  return bVar9;
}

Assistant:

bool QUrlPrivate::validateComponent(QUrlPrivate::Section section, const QString &input,
                                    qsizetype begin, qsizetype end)
{
    // What we need to look out for, that the regular parser tolerates:
    //  - percent signs not followed by two hex digits
    //  - forbidden characters, which should always appear encoded
    //    '"' / '<' / '>' / '\' / '^' / '`' / '{' / '|' / '}' / BKSP
    //    control characters
    //  - delimiters not allowed in certain positions
    //    . scheme: parser is already strict
    //    . user info: gen-delims except ":" disallowed ("/" / "?" / "#" / "[" / "]" / "@")
    //    . host: parser is stricter than the standard
    //    . port: parser is stricter than the standard
    //    . path: all delimiters allowed
    //    . fragment: all delimiters allowed
    //    . query: all delimiters allowed
    static const char forbidden[] = "\"<>\\^`{|}\x7F";
    static const char forbiddenUserInfo[] = ":/?#[]@";

    Q_ASSERT(section != Authority && section != Hierarchy && section != FullUrl);

    const ushort *const data = reinterpret_cast<const ushort *>(input.constData());
    for (size_t i = size_t(begin); i < size_t(end); ++i) {
        uint uc = data[i];
        if (uc >= 0x80)
            continue;

        bool error = false;
        if ((uc == '%' && (size_t(end) < i + 2 || !isHex(data[i + 1]) || !isHex(data[i + 2])))
                || uc <= 0x20 || strchr(forbidden, uc)) {
            // found an error
            error = true;
        } else if (section & UserInfo) {
            if (section == UserInfo && strchr(forbiddenUserInfo + 1, uc))
                error = true;
            else if (section != UserInfo && strchr(forbiddenUserInfo, uc))
                error = true;
        }

        if (!error)
            continue;

        ErrorCode errorCode = ErrorCode(int(section) << 8);
        if (section == UserInfo) {
            // is it the user name or the password?
            errorCode = InvalidUserNameError;
            for (size_t j = size_t(begin); j < i; ++j)
                if (data[j] == ':') {
                    errorCode = InvalidPasswordError;
                    break;
                }
        }

        setError(errorCode, input, i);
        return false;
    }

    // no errors
    return true;
}